

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_crazyunits_Test::TestBody(unitStrings_crazyunits_Test *this)

{
  unit_data *this_00;
  bool bVar1;
  unit *puVar2;
  char *pcVar3;
  precise_unit *un;
  uint64_t uVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lhs;
  AssertHelper local_110;
  Message local_108;
  precise_unit local_100;
  string local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  unit_data local_7c;
  unit local_78;
  unit tc;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  string str;
  unit local_18;
  unit cz;
  unitStrings_crazyunits_Test *this_local;
  
  this_00 = (unit_data *)((long)&str.field_2 + 0xc);
  uVar4 = 3;
  cz = (unit)this;
  units::detail::unit_data::unit_data(this_00,1,2,3,1,-1,-1,0,0,0,0,0,0,0,0);
  units::unit::unit(&local_18,this_00);
  puVar2 = (unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar.message_,(units *)&local_18,puVar2,uVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[25],_nullptr>
            ((EqHelper *)local_50,"str","\"m*kg^2*s^3*A*K^-1*mol^-1\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [25])"m*kg^2*s^3*A*K^-1*mol^-1");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tc,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x16c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tc,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tc);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  uVar4 = 0xfffffffd;
  units::detail::unit_data::unit_data(&local_7c,1,1,-3,0,-1,0,0,0,0,0,0,0,0,0);
  units::unit::unit(&local_78,&local_7c);
  puVar2 = (unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar_1.message_,(units *)&local_78,puVar2,uVar4);
  lhs = &gtest_ar.message_;
  std::__cxx11::string::operator=((string *)lhs,(string *)&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_b0,"str","\"W*m^-1*K^-1\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs,
             (char (*) [12])"W*m^-1*K^-1");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    lhs = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x170;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x170,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  units::precise_unit::precise_unit(&local_100,10.0,(precise_unit *)units::precise::pu);
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_f0,(units *)&local_100,un,(uint64_t)lhs);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_d0,"to_string(precise_unit(10, precise::pu))","\"10*pu\"",&local_f0,
             (char (*) [6])"10*pu");
  std::__cxx11::string::~string((string *)&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x171,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(unitStrings, crazyunits)
{
    unit cz{detail::unit_data(1, 2, 3, 1, -1, -1, 0, 0, 0, 0, 0, 0, 0, 0)};
    auto str = to_string(cz);
    EXPECT_EQ(str, "m*kg^2*s^3*A*K^-1*mol^-1");
    // thermal conductivity W/(m*K)
    unit tc{detail::unit_data(1, 1, -3, 0, -1, 0, 0, 0, 0, 0, 0, 0, 0, 0)};
    str = to_string(tc);
    EXPECT_EQ(str, "W*m^-1*K^-1");
    EXPECT_EQ(to_string(precise_unit(10, precise::pu)), "10*pu");
}